

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

void __thiscall xray_re::_lzhuf::DeleteNode(_lzhuf *this,int p)

{
  int local_18;
  int q;
  int p_local;
  _lzhuf *this_local;
  
  if (this->dad[p] != 0x1000) {
    if (this->rson[p] == 0x1000) {
      local_18 = this->lson[p];
    }
    else if (this->lson[p] == 0x1000) {
      local_18 = this->rson[p];
    }
    else {
      local_18 = this->lson[p];
      if (this->rson[local_18] != 0x1000) {
        do {
          local_18 = this->rson[local_18];
        } while (this->rson[local_18] != 0x1000);
        this->rson[this->dad[local_18]] = this->lson[local_18];
        this->dad[this->lson[local_18]] = this->dad[local_18];
        this->lson[local_18] = this->lson[p];
        this->dad[this->lson[p]] = local_18;
      }
      this->rson[local_18] = this->rson[p];
      this->dad[this->rson[p]] = local_18;
    }
    this->dad[local_18] = this->dad[p];
    if (this->rson[this->dad[p]] == p) {
      this->rson[this->dad[p]] = local_18;
    }
    else {
      this->lson[this->dad[p]] = local_18;
    }
    this->dad[p] = 0x1000;
  }
  return;
}

Assistant:

void _lzhuf::DeleteNode(int p)  /* remove from tree */
{
	int  q;

	if (dad[p] == NIL)
		return;			/* not registered */
	if (rson[p] == NIL)
		q = lson[p];
	else
	if (lson[p] == NIL)
		q = rson[p];
	else {
		q = lson[p];
		if (rson[q] != NIL) {
			do {
				q = rson[q];
			} while (rson[q] != NIL);
			rson[dad[q]] = lson[q];
			dad[lson[q]] = dad[q];
			lson[q] = lson[p];
			dad[lson[p]] = q;
		}
		rson[q] = rson[p];
		dad[rson[p]] = q;
	}
	dad[q] = dad[p];
	if (rson[dad[p]] == p)
		rson[dad[p]] = q;
	else
		lson[dad[p]] = q;
	dad[p] = NIL;
}